

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

bool_t objIsOperable(void *obj)

{
  bool_t bVar1;
  ulong uVar2;
  
  bVar1 = objIsOperable2(obj);
  if (bVar1 != 0) {
    uVar2 = 0;
    do {
      if (*(ulong *)((long)obj + 0x10) <= uVar2) {
        return 1;
      }
      bVar1 = objIsOperable(*(void **)((long)obj + uVar2 * 8 + 0x18));
      uVar2 = uVar2 + 1;
    } while (bVar1 != 0);
  }
  return 0;
}

Assistant:

bool_t objIsOperable(const void* obj)
{
	size_t i;
	// проверить сам объект
	if (!objIsOperable2(obj))
		return FALSE;
	// проверить ссылочные объекты
	for (i = 0; i < objOCount(obj); ++i)
		if (!objIsOperable(objCPtr(obj, i, void)))
			return FALSE;
	// все нормально
	return TRUE;
}